

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseData<QVariant>::resolve<QVariant>
          (PromiseData<QVariant> *this,QVariant *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  PrivateShared *pPVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  QVariant *__tmp;
  
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00150988;
  pPVar1 = (value->d).data.shared;
  uVar2 = *(undefined8 *)((long)&(value->d).data + 8);
  uVar3 = *(undefined4 *)&(value->d).field_0x18;
  uVar4 = *(undefined4 *)&(value->d).field_0x1c;
  p_Var5[2]._vptr__Sp_counted_base = *(_func_int ***)((long)&(value->d).data + 0x10);
  p_Var5[2]._M_use_count = uVar3;
  p_Var5[2]._M_weak_count = uVar4;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)pPVar1;
  p_Var5[1]._M_use_count = (int)uVar2;
  p_Var5[1]._M_weak_count = (int)((ulong)uVar2 >> 0x20);
  (value->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(value->d).data + 8) = 0;
  *(undefined8 *)((long)&(value->d).data + 0x10) = 0;
  *(undefined8 *)&(value->d).field_0x18 = 2;
  (this->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var5 + 1);
  this_00 = (this->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_value).m_data.super___shared_ptr<QVariant,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<QVariant,_void_(const_QVariant_&)>::setSettled
            (&this->super_PromiseDataBase<QVariant,_void_(const_QVariant_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }